

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

int __thiscall QFontEngine::glyphCount(QFontEngine *this)

{
  qsizetype qVar1;
  char *pcVar2;
  uchar *end_00;
  uchar *in_RDI;
  long in_FS_OFFSET;
  uchar *end;
  uchar *source;
  quint16 count;
  QByteArray maxpTable;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffb8;
  uint tag;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Tag local_24;
  QByteArray local_20;
  long local_8;
  
  tag = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QFont::Tag::Tag<5ul>(&local_24,(char (*) [5])"maxp");
  QFont::Tag::value(&local_24);
  getSfntTable((QFontEngine *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),tag);
  qVar1 = QByteArray::size(&local_20);
  if (5 < qVar1) {
    pcVar2 = QByteArray::constData((QByteArray *)0x761ea1);
    end_00 = (uchar *)(pcVar2 + 4);
    QByteArray::size(&local_20);
    qSafeFromBigEndian<unsigned_short>
              (in_RDI,end_00,
               (unsigned_short *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  QByteArray::~QByteArray((QByteArray *)0x761f04);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int QFontEngine::glyphCount() const
{
    QByteArray maxpTable = getSfntTable(QFont::Tag("maxp").value());
    if (maxpTable.size() < 6)
        return 0;

    const uchar *source = reinterpret_cast<const uchar *>(maxpTable.constData() + 4);
    const uchar *end = source + maxpTable.size();

    quint16 count = 0;
    qSafeFromBigEndian(source, end, &count);
    return count;
}